

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsNumberToInt(JsValueRef value,int *asInt)

{
  code *pcVar1;
  bool bVar2;
  Data DVar3;
  uint uVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  int iVar6;
  JsErrorCode JVar7;
  DebugCheckNoException local_38;
  DebugCheckNoException __debugCheckNoException;
  
  if (value == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (asInt == (int *)0x0) {
    return JsErrorNullArgument;
  }
  local_38._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
  local_38.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
  local_38.hasException = true;
  DVar3 = ExceptionCheck::Save();
  local_38.__exceptionCheck.handledExceptionType = DVar3.handledExceptionType;
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_0036f3aa;
    *puVar5 = 0;
  }
  if (((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)value & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_0036f3aa:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  else {
    if ((ulong)value >> 0x32 == 0) {
      JVar7 = JsErrorInvalidArgument;
      iVar6 = 0;
      goto LAB_0036f388;
    }
    uVar4 = Js::JavascriptConversion::ToInt32((double)((ulong)value ^ 0xfffc000000000000));
    value = (JsValueRef)(ulong)uVar4;
  }
  iVar6 = (int)value;
  JVar7 = JsNoError;
LAB_0036f388:
  *asInt = iVar6;
  local_38.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_38);
  return JVar7;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsNumberToInt(_In_ JsValueRef value, _Out_ int *asInt)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(asInt);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (Js::TaggedInt::Is(value))
        {
            *asInt = Js::TaggedInt::ToInt32(value);
        }